

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.h
# Opt level: O2

Range * __thiscall
spvtools::opt::
MakeFilterIteratorRange<std::__detail::_Node_iterator<spvtools::opt::Instruction*,true,false>,spvtools::opt::RegisterLiveness::SimulateFission(spvtools::opt::Loop_const&,std::unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>const&,std::unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>const&,spvtools::opt::RegisterLiveness::RegionRegisterLiveness*,spvtools::opt::RegisterLiveness::RegionRegisterLiveness*)const::__0>
          (Range *__return_storage_ptr__,opt *this,
          _Node_iterator<spvtools::opt::Instruction_*,_true,_false> *begin,
          _Node_iterator<spvtools::opt::Instruction_*,_true,_false> *end,
          anon_class_24_3_72e690ea predicate)

{
  MakeFilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction*,true,false>,spvtools::opt::RegisterLiveness::SimulateFission(spvtools::opt::Loop_const&,std::unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>const&,std::unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>const&,spvtools::opt::RegisterLiveness::RegionRegisterLiveness*,spvtools::opt::RegisterLiveness::RegionRegisterLiveness*)const::__0>
            (&__return_storage_ptr__->begin_,this,begin,end,predicate);
  MakeFilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction*,true,false>,spvtools::opt::RegisterLiveness::SimulateFission(spvtools::opt::Loop_const&,std::unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>const&,std::unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>const&,spvtools::opt::RegisterLiveness::RegionRegisterLiveness*,spvtools::opt::RegisterLiveness::RegionRegisterLiveness*)const::__0>
            (&__return_storage_ptr__->end_,(opt *)begin,begin,end,predicate);
  return __return_storage_ptr__;
}

Assistant:

typename FilterIterator<SubIterator, Predicate>::Range MakeFilterIteratorRange(
    const SubIterator& begin, const SubIterator& end, Predicate predicate) {
  return typename FilterIterator<SubIterator, Predicate>::Range(
      MakeFilterIterator(begin, end, predicate),
      MakeFilterIterator(end, end, predicate));
}